

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall
embree::ISPCScene::ISPCScene
          (ISPCScene *this,RTCDevice device,uint numGeometries,uint numMaterials,uint numLights)

{
  RTCScene pRVar1;
  ISPCGeometry **ppIVar2;
  ISPCMaterial **ppIVar3;
  Light **ppLVar4;
  ulong uVar5;
  
  pRVar1 = (RTCScene)rtcNewScene(device);
  this->scene = pRVar1;
  this->geometries = (ISPCGeometry **)0x0;
  this->materials = (ISPCMaterial **)0x0;
  this->numGeometries = numGeometries;
  this->numMaterials = numMaterials;
  this->lights = (Light **)0x0;
  this->numLights = numLights;
  this->tutorialScene = (void *)0x0;
  ppIVar2 = (ISPCGeometry **)alignedUSMMalloc((ulong)numGeometries * 8,0x10,DEVICE_READ_ONLY);
  this->geometries = ppIVar2;
  if (numGeometries != 0) {
    uVar5 = 0;
    do {
      this->geometries[uVar5] = (ISPCGeometry *)0x0;
      uVar5 = uVar5 + 1;
    } while (numGeometries != uVar5);
  }
  ppIVar3 = (ISPCMaterial **)alignedUSMMalloc((ulong)numMaterials * 8,0x10,DEVICE_READ_ONLY);
  this->materials = ppIVar3;
  if (numMaterials != 0) {
    uVar5 = 0;
    do {
      this->materials[uVar5] = (ISPCMaterial *)0x0;
      uVar5 = uVar5 + 1;
    } while (numMaterials != uVar5);
  }
  ppLVar4 = (Light **)alignedUSMMalloc((ulong)numLights * 8,0x10,DEVICE_READ_ONLY);
  this->lights = ppLVar4;
  if (numLights != 0) {
    uVar5 = 0;
    do {
      this->lights[uVar5] = (Light *)0x0;
      uVar5 = uVar5 + 1;
    } while (numLights != uVar5);
  }
  return;
}

Assistant:

ISPCScene::ISPCScene(RTCDevice device, unsigned int numGeometries, unsigned int numMaterials, unsigned int numLights)
    : scene(rtcNewScene(device)), geometries(nullptr), materials(nullptr), numGeometries(numGeometries), numMaterials(numMaterials), lights(0), numLights(numLights), tutorialScene(nullptr)
  {
    geometries = (ISPCGeometry**) alignedUSMMalloc(numGeometries*sizeof(ISPCGeometry*));
    for (size_t i=0; i<numGeometries; i++) geometries[i] = nullptr;
    
    materials = (ISPCMaterial**) alignedUSMMalloc(numMaterials*sizeof(ISPCMaterial*));
    for (size_t i=0; i<numMaterials; i++) materials[i] = nullptr;
    
    lights = (Light**) alignedUSMMalloc(numLights*sizeof(Light*));
    for (size_t i=0; i<numLights; i++) lights[i] = nullptr;
  }